

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall slang::driver::Driver::printWarning(Driver *this,string *message)

{
  string_view text;
  string_view text_00;
  element_type *peVar1;
  __sv_type _Var2;
  color_type in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  text_style *in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffc8;
  
  peVar1 = std::
           __shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xb640bf);
  ::fmt::v11::detail::color_type::color_type
            ((color_type *)&stack0xffffffffffffffd4,(peVar1->super_DiagnosticClient).field_0x1a);
  ::fmt::v11::fg(in_stack_ffffffffffffffa0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  OS::printE(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffffa0);
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)_Var2._M_len;
  text._M_str = (char *)this_00;
  text._M_len = (size_t)in_stack_ffffffffffffffa8;
  OS::printE(text);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this_00,in_stack_ffffffffffffffa8);
  text_00._M_str = (char *)this_00;
  text_00._M_len = (size_t)in_stack_ffffffffffffffa8;
  OS::printE(text_00);
  return;
}

Assistant:

void Driver::printWarning(const std::string& message) {
    OS::printE(fg(textDiagClient->warningColor), "warning: ");
    OS::printE(message);
    OS::printE("\n");
}